

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_float32_suite::test_array16_float32_one(void)

{
  value_type expected [4];
  value_type input [7];
  decoder decoder;
  value local_6c;
  value local_68 [2];
  uchar local_60 [8];
  decoder local_58;
  
  local_60[4] = '\0';
  local_60[5] = 0x80;
  local_60[6] = '?';
  local_60[0] = 0xbd;
  local_60[1] = '\x04';
  local_60[2] = '\0';
  local_60[3] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[7]>
            (&local_58,(uchar (*) [7])local_60);
  local_6c = local_58.current.code;
  local_68[0] = 0xbd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array16_float32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd57,"void compact_float32_suite::test_array16_float32_one()",&local_6c,local_68);
  local_6c = trial::protocol::bintoken::token::symbol::convert(local_58.current.code);
  local_68[0] = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd58,"void compact_float32_suite::test_array16_float32_one()",&local_6c,local_68);
  local_6c = trial::protocol::bintoken::detail::decoder::category(&local_58);
  local_68[0] = data;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd59,"void compact_float32_suite::test_array16_float32_one()",&local_6c,local_68);
  local_6c = 0x3f800000;
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd5f,"void compact_float32_suite::test_array16_float32_one()",
             local_58.current.view._M_str,
             local_58.current.view._M_str + local_58.current.view._M_len,&local_6c,local_68);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_68[0] = local_58.current.code;
  local_68[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xd61,"void compact_float32_suite::test_array16_float32_one()",local_68,local_68 + 1);
  return;
}

Assistant:

void test_array16_float32_one()
{
    const value_type input[] = { token::code::array16_float32, 0x04, 0x00, 0x00, 0x00, 0x80, 0x3F };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array16_float32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x00, 0x00, 0x80, 0x3F
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}